

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

LPVOID HeapReAlloc(HANDLE hHeap,DWORD dwFlags,LPVOID lpmem,SIZE_T numberOfBytes)

{
  void *local_30;
  BYTE *pMem;
  SIZE_T numberOfBytes_local;
  LPVOID lpmem_local;
  DWORD dwFlags_local;
  HANDLE hHeap_local;
  
  local_30 = (void *)0x0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (hHeap == (HANDLE)0x1020304) {
    if (dwFlags == 0) {
      if (lpmem == (LPVOID)0x0) {
        if (!PAL_InitializeChakraCoreCalled) {
          abort();
        }
        SetLastError(0);
      }
      else {
        pMem = (BYTE *)numberOfBytes;
        if (numberOfBytes == 0) {
          pMem = (BYTE *)0x1;
        }
        local_30 = PAL_realloc(lpmem,(size_t)pMem);
        if (local_30 == (void *)0x0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          SetLastError(8);
        }
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","HeapReAlloc",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/heap.cpp"
              ,0x178);
      fprintf(_stderr,"Invalid parameter dwFlags=%#x\n",(ulong)dwFlags);
      SetLastError(0x57);
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","HeapReAlloc",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/heap.cpp"
            ,0x171);
    fprintf(_stderr,"Invalid heap handle\n");
    SetLastError(6);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_30;
  }
  abort();
}

Assistant:

LPVOID
PALAPI
HeapReAlloc(
    IN HANDLE hHeap,
    IN DWORD dwFlags,
    IN LPVOID lpmem,
    IN SIZE_T numberOfBytes)
{
    BYTE *pMem = NULL;

    PERF_ENTRY(HeapReAlloc);
    ENTRY("HeapReAlloc (hHeap=%p, dwFlags=%#x, lpmem=%p, numberOfBytes=%u)\n",
          hHeap, dwFlags, lpmem, numberOfBytes);

#ifdef __APPLE__
    if (hHeap == NULL)
#else // __APPLE__
    if (hHeap != (HANDLE)DUMMY_HEAP)
#endif // __APPLE__ else
    {
        ASSERT("Invalid heap handle\n");
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }

    if ((dwFlags != 0))
    {
        ASSERT("Invalid parameter dwFlags=%#x\n", dwFlags);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (lpmem == NULL)
    {
        WARN("NULL memory pointer to realloc. Do not do anything.\n");
        /* set LastError back to zero. this appears to be an undocumented
        behavior in Windows, in doesn't cost much to match it */
        SetLastError(0);
        goto done;
    }

    if(numberOfBytes == 0)
    {
        // PAL's realloc behaves like free for a requested size of zero bytes. Force a nonzero size to get a valid pointer.
        numberOfBytes = 1;
    }

#ifdef __APPLE__
    // This is patterned off of InternalRealloc in malloc.cpp.
    {
        pMem = (BYTE *) malloc_zone_realloc((malloc_zone_t *)hHeap, lpmem, numberOfBytes);
    }
#else // __APPLE__
    pMem = (BYTE *) PAL_realloc(lpmem, numberOfBytes);
#endif // __APPLE__ else

    if (pMem == NULL)
    {
        ERROR("Not enough memory\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }

done:
    LOGEXIT("HeapReAlloc returns LPVOID %p\n", pMem);
    PERF_EXIT(HeapReAlloc);
    return pMem;
}